

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS
ref_import_bin_ugrid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename,REF_BOOL swap,REF_BOOL fat
          )

{
  REF_DBL *pRVar1;
  REF_GRID_conflict pRVar2;
  REF_NODE ref_node;
  ulong uVar3;
  REF_DBL *pRVar4;
  REF_DBL RVar5;
  uint uVar6;
  int iVar7;
  FILE *__stream;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 uVar12;
  size_t __n;
  REF_GLOB global;
  long lVar13;
  char *pcVar14;
  REF_INT new_node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  long local_50;
  ulong local_48;
  void *local_40;
  long local_38;
  
  uVar6 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar6 == 0) {
    pRVar2 = *ref_grid_ptr;
    ref_node = pRVar2->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar14 = "unable to open file";
      uVar12 = 0x233;
LAB_001e1ef6:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar12,"ref_import_bin_ugrid",pcVar14);
      return 2;
    }
    uVar6 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&nnode);
    if (uVar6 == 0) {
      uVar6 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&ntri);
      if (uVar6 == 0) {
        uVar6 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&nqua);
        if (uVar6 == 0) {
          uVar6 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&ntet);
          if (uVar6 == 0) {
            uVar6 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&npyr);
            if (uVar6 == 0) {
              uVar6 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&npri);
              if (uVar6 == 0) {
                uVar6 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&nhex);
                if (uVar6 != 0) {
                  pcVar14 = "nhex";
                  uVar12 = 0x23b;
LAB_001e2086:
                  uVar10 = (ulong)uVar6;
                  goto LAB_001e1e47;
                }
                if (0 < ref_mpi->timing) {
                  ref_mpi_stopwatch_stop(ref_mpi,"ugrid header");
                }
                local_50 = (long)nnode;
                uVar11 = 1000000;
                if (nnode < 1000000) {
                  uVar11 = nnode;
                }
                if (local_50 < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x241,"ref_import_bin_ugrid","malloc xyz of REF_DBL negative");
                  return 1;
                }
                local_40 = malloc((ulong)(uVar11 * 0x18));
                if (local_40 == (void *)0x0) {
                  pcVar14 = "malloc xyz of REF_DBL NULL";
                  uVar12 = 0x241;
                  goto LAB_001e1ef6;
                }
                for (iVar7 = 0; uVar6 = (int)local_50 - iVar7, uVar6 != 0 && iVar7 <= (int)local_50;
                    iVar7 = (int)local_48 + iVar7) {
                  if ((int)uVar11 < (int)uVar6) {
                    uVar6 = uVar11;
                  }
                  local_48 = (ulong)uVar6;
                  uVar6 = uVar6 * 3;
                  uVar10 = (ulong)uVar6;
                  __n = (size_t)(int)uVar6;
                  sVar8 = fread(local_40,8,__n,__stream);
                  if (sVar8 != __n) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x246,"ref_import_bin_ugrid","xyz",__n,sVar8);
                    return 1;
                  }
                  if (swap != 0) {
                    if ((int)uVar6 < 1) {
                      uVar10 = 0;
                    }
                    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
                      uVar3 = *(ulong *)((long)local_40 + uVar9 * 8);
                      *(ulong *)((long)local_40 + uVar9 * 8) =
                           uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                           (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                           (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
                    }
                  }
                  global = (REF_GLOB)iVar7;
                  uVar10 = 0;
                  if (0 < (int)local_48) {
                    uVar10 = local_48 & 0xffffffff;
                  }
                  local_38 = uVar10 * 0x18;
                  for (lVar13 = 0; local_38 != lVar13; lVar13 = lVar13 + 0x18) {
                    uVar6 = ref_node_add(ref_node,global,&new_node);
                    if (uVar6 != 0) {
                      pcVar14 = "new_node";
                      uVar12 = 0x24a;
                      goto LAB_001e2086;
                    }
                    pRVar4 = ref_node->real;
                    RVar5 = ((REF_DBL *)((long)local_40 + lVar13))[1];
                    pRVar1 = pRVar4 + (long)new_node * 0xf;
                    *pRVar1 = *(REF_DBL *)((long)local_40 + lVar13);
                    pRVar1[1] = RVar5;
                    pRVar4[(long)new_node * 0xf + 2] = *(REF_DBL *)((long)local_40 + lVar13 + 0x10);
                    global = global + 1;
                  }
                }
                free(local_40);
                uVar6 = ref_node_initialize_n_global(ref_node,local_50);
                if (uVar6 == 0) {
                  if (0 < ref_mpi->timing) {
                    ref_mpi_stopwatch_stop(ref_mpi,"ugrid node");
                  }
                  uVar6 = ref_import_bin_ugrid_c2n(pRVar2->cell[3],ntri,(FILE *)__stream,swap,fat);
                  if (uVar6 == 0) {
                    uVar6 = ref_import_bin_ugrid_c2n(pRVar2->cell[6],nqua,(FILE *)__stream,swap,fat)
                    ;
                    if (uVar6 == 0) {
                      uVar6 = ref_import_bin_ugrid_bound_tag
                                        (pRVar2->cell[3],ntri,(FILE *)__stream,swap,fat);
                      if (uVar6 == 0) {
                        uVar6 = ref_import_bin_ugrid_bound_tag
                                          (pRVar2->cell[6],nqua,(FILE *)__stream,swap,fat);
                        if (uVar6 == 0) {
                          if (0 < ref_mpi->timing) {
                            ref_mpi_stopwatch_stop(ref_mpi,"ugrid tri");
                          }
                          uVar6 = ref_import_bin_ugrid_c2n
                                            (pRVar2->cell[8],ntet,(FILE *)__stream,swap,fat);
                          if (uVar6 == 0) {
                            if (0 < ref_mpi->timing) {
                              ref_mpi_stopwatch_stop(ref_mpi,"ugrid tet");
                            }
                            uVar6 = ref_import_bin_ugrid_c2n
                                              (pRVar2->cell[9],npyr,(FILE *)__stream,swap,fat);
                            if (uVar6 == 0) {
                              if (0 < ref_mpi->timing) {
                                ref_mpi_stopwatch_stop(ref_mpi,"ugrid pyr");
                              }
                              uVar6 = ref_import_bin_ugrid_c2n
                                                (pRVar2->cell[10],npri,(FILE *)__stream,swap,fat);
                              if (uVar6 == 0) {
                                if (0 < ref_mpi->timing) {
                                  ref_mpi_stopwatch_stop(ref_mpi,"ugrid pri");
                                }
                                uVar6 = ref_import_bin_ugrid_c2n
                                                  (pRVar2->cell[0xb],nhex,(FILE *)__stream,swap,fat)
                                ;
                                if (uVar6 == 0) {
                                  if (0 < ref_mpi->timing) {
                                    ref_mpi_stopwatch_stop(ref_mpi,"ugrid hex");
                                  }
                                  fclose(__stream);
                                  return 0;
                                }
                                uVar10 = (ulong)uVar6;
                                pcVar14 = "hex face nodes";
                                uVar12 = 0x26e;
                              }
                              else {
                                uVar10 = (ulong)uVar6;
                                pcVar14 = "pri face nodes";
                                uVar12 = 0x26b;
                              }
                            }
                            else {
                              uVar10 = (ulong)uVar6;
                              pcVar14 = "pyr face nodes";
                              uVar12 = 0x268;
                            }
                          }
                          else {
                            uVar10 = (ulong)uVar6;
                            pcVar14 = "tet face nodes";
                            uVar12 = 0x265;
                          }
                        }
                        else {
                          uVar10 = (ulong)uVar6;
                          pcVar14 = "tri face tags";
                          uVar12 = 0x261;
                        }
                      }
                      else {
                        uVar10 = (ulong)uVar6;
                        pcVar14 = "tri face tags";
                        uVar12 = 0x25e;
                      }
                    }
                    else {
                      uVar10 = (ulong)uVar6;
                      pcVar14 = "qua face nodes";
                      uVar12 = 0x25a;
                    }
                  }
                  else {
                    uVar10 = (ulong)uVar6;
                    pcVar14 = "tri face nodes";
                    uVar12 = 600;
                  }
                }
                else {
                  uVar10 = (ulong)uVar6;
                  pcVar14 = "init glob";
                  uVar12 = 0x253;
                }
              }
              else {
                uVar10 = (ulong)uVar6;
                pcVar14 = "npri";
                uVar12 = 0x23a;
              }
            }
            else {
              uVar10 = (ulong)uVar6;
              pcVar14 = "npyr";
              uVar12 = 0x239;
            }
          }
          else {
            uVar10 = (ulong)uVar6;
            pcVar14 = "ntet";
            uVar12 = 0x238;
          }
        }
        else {
          uVar10 = (ulong)uVar6;
          pcVar14 = "nqua";
          uVar12 = 0x237;
        }
      }
      else {
        uVar10 = (ulong)uVar6;
        pcVar14 = "ntri";
        uVar12 = 0x236;
      }
    }
    else {
      uVar10 = (ulong)uVar6;
      pcVar14 = "nnode";
      uVar12 = 0x235;
    }
  }
  else {
    uVar10 = (ulong)uVar6;
    pcVar14 = "create grid";
    uVar12 = 0x22d;
  }
  uVar6 = (uint)uVar10;
LAB_001e1e47:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar12,
         "ref_import_bin_ugrid",uVar10,pcVar14);
  return uVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;

  REF_INT node, new_node;
  REF_INT max_chunk, nread, chunk, ixyz;
  REF_DBL *xyz;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nnode), "nnode");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntri), "ntri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nqua), "nqua");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntet), "ntet");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npyr), "npyr");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npri), "npri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nhex), "nhex");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  /* large block reads recommended for IO performance */
  max_chunk = MIN(1000000, nnode);
  ref_malloc(xyz, 3 * max_chunk, REF_DBL);
  nread = 0;
  while (nread < nnode) {
    chunk = MIN(max_chunk, nnode - nread);
    REIS(3 * chunk, fread(xyz, sizeof(REF_DBL), (size_t)(3 * chunk), file),
         "xyz");
    if (swap)
      for (ixyz = 0; ixyz < 3 * chunk; ixyz++) SWAP_DBL(xyz[ixyz]);
    for (node = 0; node < chunk; node++) {
      RSS(ref_node_add(ref_node, node + nread, &new_node), "new_node");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
    }
    nread += chunk;
  }
  ref_free(xyz);

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tri(ref_grid), ntri, file, swap, fat),
      "tri face nodes");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_qua(ref_grid), nqua, file, swap, fat),
      "qua face nodes");

  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_tri(ref_grid), ntri, file, swap,
                                     fat),
      "tri face tags");
  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_qua(ref_grid), nqua, file, swap,
                                     fat),
      "tri face tags");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tri");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tet(ref_grid), ntet, file, swap, fat),
      "tet face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tet");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pyr(ref_grid), npyr, file, swap, fat),
      "pyr face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pyr");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pri(ref_grid), npri, file, swap, fat),
      "pri face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pri");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_hex(ref_grid), nhex, file, swap, fat),
      "hex face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid hex");

  fclose(file);

  return REF_SUCCESS;
}